

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

FeatureSetDefaults * __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest::ReadEditionDefaults
          (FeatureSetDefaults *__return_storage_ptr__,CommandLineInterfaceTest *this,
          string_view filename)

{
  bool bVar1;
  FeatureSetDefaults *extraout_RAX;
  FeatureSetDefaults *pFVar2;
  string_view filename_00;
  string_view data;
  string_view str;
  string file_contents;
  LogMessage local_50;
  undefined1 local_40 [32];
  
  FeatureSetDefaults::FeatureSetDefaults(__return_storage_ptr__,(Arena *)0x0);
  filename_00._M_str = (char *)filename._M_len;
  filename_00._M_len = (this->super_CommandLineInterfaceTester).temp_directory_._M_string_length;
  compiler::(anonymous_namespace)::CommandLineInterfaceTest::ReadFile_abi_cxx11_
            ((string *)local_40,
             (this->super_CommandLineInterfaceTester).temp_directory_._M_dataplus._M_p,filename_00);
  data._M_str = (char *)local_40._0_8_;
  data._M_len = local_40._8_8_;
  bVar1 = MessageLite::ParseFromString((MessageLite *)__return_storage_ptr__,data);
  if (bVar1) {
    pFVar2 = (FeatureSetDefaults *)(local_40 + 0x10);
    if ((FeatureSetDefaults *)local_40._0_8_ != pFVar2) {
      operator_delete((void *)local_40._0_8_,local_40._16_8_ + 1);
      pFVar2 = extraout_RAX;
    }
    return pFVar2;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
             ,0x167,"defaults.ParseFromString(file_contents)");
  str._M_str = "Could not parse file contents: ";
  str._M_len = 0x1f;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_50,str);
  absl::lts_20250127::log_internal::LogMessage::operator<<(&local_50,filename);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

FeatureSetDefaults CommandLineInterfaceTest::ReadEditionDefaults(
    absl::string_view filename) {
  FeatureSetDefaults defaults;
  std::string file_contents = ReadFile(filename);
  ABSL_CHECK(defaults.ParseFromString(file_contents))
      << "Could not parse file contents: " << filename;
  return defaults;
}